

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  int iVar1;
  int iVar2;
  ColumnNumber CVar3;
  Rep *pRVar4;
  SourceCodeInfo_Location *pSVar5;
  Location *pLVar6;
  SourceCodeInfo_Location *pSVar7;
  
  this->parser_ = parent->parser_;
  this->source_code_info_ = source_code_info;
  pRVar4 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0030c8fc:
    internal::RepeatedPtrFieldBase::Reserve
              (&(source_code_info->location_).super_RepeatedPtrFieldBase,
               (source_code_info->location_).super_RepeatedPtrFieldBase.total_size_ + 1);
  }
  else {
    iVar1 = (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pSVar7 = (SourceCodeInfo_Location *)pRVar4->elements[iVar1];
      goto LAB_0030c931;
    }
    if (pRVar4->allocated_size ==
        (source_code_info->location_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0030c8fc;
  }
  pRVar4 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
  pRVar4->allocated_size = pRVar4->allocated_size + 1;
  pSVar7 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo_Location>
                     ((source_code_info->location_).super_RepeatedPtrFieldBase.arena_);
  pRVar4 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_;
  (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar4->elements[iVar1] = pSVar7;
LAB_0030c931:
  this->location_ = pSVar7;
  pSVar5 = parent->location_;
  if (pSVar5 != pSVar7) {
    (pSVar7->path_).current_size_ = 0;
    iVar1 = (pSVar5->path_).current_size_;
    if (iVar1 != 0) {
      RepeatedField<int>::Reserve(&pSVar7->path_,iVar1);
      (pSVar7->path_).current_size_ = (pSVar7->path_).current_size_ + (pSVar5->path_).current_size_;
      memcpy((pSVar7->path_).arena_or_elements_,(pSVar5->path_).arena_or_elements_,
             (long)(pSVar5->path_).current_size_ << 2);
    }
  }
  pLVar6 = this->location_;
  iVar1 = (this->parser_->input_->current_).line;
  iVar2 = (pLVar6->span_).total_size_;
  if ((pLVar6->span_).current_size_ == iVar2) {
    RepeatedField<int>::Reserve(&pLVar6->span_,iVar2 + 1);
  }
  iVar2 = (pLVar6->span_).current_size_;
  (pLVar6->span_).current_size_ = iVar2 + 1;
  *(int *)((long)(pLVar6->span_).arena_or_elements_ + (long)iVar2 * 4) = iVar1;
  pLVar6 = this->location_;
  CVar3 = (this->parser_->input_->current_).column;
  iVar1 = (pLVar6->span_).total_size_;
  if ((pLVar6->span_).current_size_ == iVar1) {
    RepeatedField<int>::Reserve(&pLVar6->span_,iVar1 + 1);
  }
  iVar1 = (pLVar6->span_).current_size_;
  (pLVar6->span_).current_size_ = iVar1 + 1;
  *(ColumnNumber *)((long)(pLVar6->span_).arena_or_elements_ + (long)iVar1 * 4) = CVar3;
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}